

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsFromRootToBranch(tst_GenericModel *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QVariant local_650;
  QVariant local_630;
  QVariant local_610;
  QArrayDataPointer<char16_t> local_5f0;
  QString local_5d8;
  QModelIndex local_5c0;
  QModelIndex local_5a8;
  QVariant local_590;
  QString local_570;
  QArrayDataPointer<char16_t> local_558;
  QString local_540;
  QModelIndex local_528;
  QModelIndex local_510;
  QVariant local_4f8;
  QString local_4d8;
  QArrayDataPointer<char16_t> local_4c0;
  QString local_4a8;
  QModelIndex local_490;
  QModelIndex local_478;
  QVariant local_460;
  QString local_440;
  QModelIndex local_428;
  QVariant local_410;
  QModelIndex local_3f0;
  QVariant local_3d8;
  QModelIndex local_3b8;
  QModelIndex local_3a0;
  QArrayDataPointer<char16_t> local_388;
  QString local_370;
  QModelIndex local_358;
  QVariant local_340;
  QString local_320;
  QArrayDataPointer<char16_t> local_308;
  QString local_2f0;
  QModelIndex local_2d8;
  QVariant local_2c0;
  QString local_2a0;
  QArrayDataPointer<char16_t> local_288;
  QString local_270;
  QModelIndex local_258;
  QVariant local_240;
  QString local_220;
  QArrayDataPointer<char16_t> local_208;
  QString local_1f0;
  QModelIndex local_1d8;
  QVariant local_1c0;
  QString local_1a0;
  QModelIndex local_188;
  QModelIndex local_170;
  undefined4 local_154;
  QModelIndex local_150;
  QModelIndex local_138;
  undefined1 local_120 [8];
  QModelIndex parIndex;
  undefined1 local_e0 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_e0,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  fillTable(this,(QAbstractItemModel *)&probe.field_0x8,5,3,(QModelIndex *)&parIndex.m,0);
  QModelIndex::QModelIndex(&local_138);
  GenericModel::index((int)local_120,(int)&probe + 8,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x4);
  QAbstractItemModel::insertRow((QAbstractItemModel *)&probe.field_0x8,0,(QModelIndex *)local_120);
  QModelIndex::QModelIndex(&local_150);
  bVar1 = GenericModel::moveRows
                    ((QModelIndex *)&probe.field_0x8,(int)&local_150,2,(QModelIndex *)0x2,
                     (int)local_120);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1)",""
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x7a0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
    bVar1 = QTest::qCompare(iVar3,3,"testModel.rowCount(parIndex)","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x7a1);
    if ((bVar1 & 1) == 0) {
      local_154 = 1;
    }
    else {
      iVar3 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
      bVar1 = QTest::qCompare(iVar3,4,"testModel.columnCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x7a2);
      if ((bVar1 & 1) == 0) {
        local_154 = 1;
      }
      else {
        QModelIndex::QModelIndex(&local_170);
        iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
        bVar1 = QTest::qCompare(iVar3,3,"testModel.rowCount()","3",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x7a3);
        if (((bVar1 ^ 0xff) & 1) == 0) {
          QModelIndex::QModelIndex(&local_188);
          iVar3 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
          bVar1 = QTest::qCompare(iVar3,3,"testModel.columnCount()","3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x7a4);
          if (((bVar1 ^ 0xff) & 1) == 0) {
            GenericModel::index((int)&local_1d8,(int)&probe + 8,(QModelIndex *)0x1);
            QModelIndex::data(&local_1c0,&local_1d8,0);
            QVariant::toString();
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_208,(Data *)0x0,L"2,0",3);
            QString::QString(&local_1f0,&local_208);
            bVar2 = QTest::qCompare(&local_1a0,&local_1f0,
                                    "testModel.index(1, 0, parIndex).data().toString()",
                                    "QStringLiteral(\"2,0\")",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x7a6);
            QString::~QString(&local_1f0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
            QString::~QString(&local_1a0);
            QVariant::~QVariant(&local_1c0);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              GenericModel::index((int)&local_258,(int)&probe + 8,(QModelIndex *)0x2);
              QModelIndex::data(&local_240,&local_258,0);
              QVariant::toString();
              QArrayDataPointer<char16_t>::QArrayDataPointer(&local_288,(Data *)0x0,L"3,0",3);
              QString::QString(&local_270,&local_288);
              bVar2 = QTest::qCompare(&local_220,&local_270,
                                      "testModel.index(2, 0, parIndex).data().toString()",
                                      "QStringLiteral(\"3,0\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x7a7);
              QString::~QString(&local_270);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
              QString::~QString(&local_220);
              QVariant::~QVariant(&local_240);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                GenericModel::index((int)&local_2d8,(int)&probe + 8,(QModelIndex *)0x1);
                QModelIndex::data(&local_2c0,&local_2d8,0);
                QVariant::toString();
                QArrayDataPointer<char16_t>::QArrayDataPointer(&local_308,(Data *)0x0,L"2,2",3);
                QString::QString(&local_2f0,&local_308);
                bVar2 = QTest::qCompare(&local_2a0,&local_2f0,
                                        "testModel.index(1, 2, parIndex).data().toString()",
                                        "QStringLiteral(\"2,2\")",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x7a8);
                QString::~QString(&local_2f0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
                QString::~QString(&local_2a0);
                QVariant::~QVariant(&local_2c0);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  GenericModel::index((int)&local_358,(int)&probe + 8,(QModelIndex *)0x2);
                  QModelIndex::data(&local_340,&local_358,0);
                  QVariant::toString();
                  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_388,(Data *)0x0,L"3,2",3);
                  QString::QString(&local_370,&local_388);
                  bVar2 = QTest::qCompare(&local_320,&local_370,
                                          "testModel.index(2, 2, parIndex).data().toString()",
                                          "QStringLiteral(\"3,2\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x7a9);
                  QString::~QString(&local_370);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_388);
                  QString::~QString(&local_320);
                  QVariant::~QVariant(&local_340);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    GenericModel::index((int)&local_3a0,(int)&probe + 8,(QModelIndex *)0x1);
                    bVar2 = QModelIndex::isValid(&local_3a0);
                    bVar1 = QTest::qVerify(bVar2,"testModel.index(1, 3, parIndex).isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x7aa);
                    if (((bVar1 ^ 0xff) & 1) == 0) {
                      GenericModel::index((int)&local_3b8,(int)&probe + 8,(QModelIndex *)0x2);
                      bVar2 = QModelIndex::isValid(&local_3b8);
                      bVar1 = QTest::qVerify(bVar2,"testModel.index(2, 3, parIndex).isValid()","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x7ab);
                      if (((bVar1 ^ 0xff) & 1) == 0) {
                        GenericModel::index((int)&local_3f0,(int)&probe + 8,(QModelIndex *)0x1);
                        QModelIndex::data(&local_3d8,&local_3f0,0);
                        bVar2 = QVariant::isValid(&local_3d8);
                        bVar1 = QTest::qVerify((bool)(~bVar2 & 1),
                                               "!testModel.index(1, 3, parIndex).data().isValid()",
                                               "",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x7ac);
                        QVariant::~QVariant(&local_3d8);
                        if (((bVar1 ^ 0xff) & 1) == 0) {
                          GenericModel::index((int)&local_428,(int)&probe + 8,(QModelIndex *)0x2);
                          QModelIndex::data(&local_410,&local_428,0);
                          bVar2 = QVariant::isValid(&local_410);
                          bVar1 = QTest::qVerify((bool)(~bVar2 & 1),
                                                 "!testModel.index(2, 3, parIndex).data().isValid()"
                                                 ,"",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x7ad);
                          QVariant::~QVariant(&local_410);
                          if (((bVar1 ^ 0xff) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_490);
                            GenericModel::index((int)&local_478,(int)&probe + 8,(QModelIndex *)0x0);
                            QModelIndex::data(&local_460,&local_478,0);
                            QVariant::toString();
                            QArrayDataPointer<char16_t>::QArrayDataPointer
                                      (&local_4c0,(Data *)0x0,L"0,0",3);
                            QString::QString(&local_4a8,&local_4c0);
                            bVar2 = QTest::qCompare(&local_440,&local_4a8,
                                                    "testModel.index(0, 0).data().toString()",
                                                    "QStringLiteral(\"0,0\")",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7ae);
                            QString::~QString(&local_4a8);
                            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c0);
                            QString::~QString(&local_440);
                            QVariant::~QVariant(&local_460);
                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                              QModelIndex::QModelIndex(&local_528);
                              GenericModel::index((int)&local_510,(int)&probe + 8,(QModelIndex *)0x1
                                                 );
                              QModelIndex::data(&local_4f8,&local_510,0);
                              QVariant::toString();
                              QArrayDataPointer<char16_t>::QArrayDataPointer
                                        (&local_558,(Data *)0x0,L"1,0",3);
                              QString::QString(&local_540,&local_558);
                              bVar2 = QTest::qCompare(&local_4d8,&local_540,
                                                      "testModel.index(1, 0).data().toString()",
                                                      "QStringLiteral(\"1,0\")",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7af);
                              QString::~QString(&local_540);
                              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_558);
                              QString::~QString(&local_4d8);
                              QVariant::~QVariant(&local_4f8);
                              if (((bVar2 ^ 0xffU) & 1) == 0) {
                                QModelIndex::QModelIndex(&local_5c0);
                                GenericModel::index((int)&local_5a8,(int)&probe + 8,
                                                    (QModelIndex *)0x2);
                                QModelIndex::data(&local_590,&local_5a8,0);
                                QVariant::toString();
                                QArrayDataPointer<char16_t>::QArrayDataPointer
                                          (&local_5f0,(Data *)0x0,L"4,0",3);
                                QString::QString(&local_5d8,&local_5f0);
                                bVar2 = QTest::qCompare(&local_570,&local_5d8,
                                                        "testModel.index(2, 0).data().toString()",
                                                        "QStringLiteral(\"4,0\")",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b0);
                                QString::~QString(&local_5d8);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_5f0);
                                QString::~QString(&local_570);
                                QVariant::~QVariant(&local_590);
                                if (((bVar2 ^ 0xffU) & 1) == 0) {
                                  GenericModel::headerData((int)&local_610,(int)&probe + 8,0);
                                  iVar3 = QVariant::toInt((bool *)&local_610);
                                  bVar1 = QTest::qCompare(iVar3,0,
                                                  "testModel.headerData(0, Qt::Vertical).toInt()",
                                                  "0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b1);
                                  QVariant::~QVariant(&local_610);
                                  if (((bVar1 ^ 0xff) & 1) == 0) {
                                    GenericModel::headerData((int)&local_630,(int)&probe + 8,1);
                                    iVar3 = QVariant::toInt((bool *)&local_630);
                                    bVar1 = QTest::qCompare(iVar3,1,
                                                  "testModel.headerData(1, Qt::Vertical).toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b2);
                                    QVariant::~QVariant(&local_630);
                                    if (((bVar1 ^ 0xff) & 1) == 0) {
                                      GenericModel::headerData((int)&local_650,(int)&probe + 8,2);
                                      iVar3 = QVariant::toInt((bool *)&local_650);
                                      bVar1 = QTest::qCompare(iVar3,4,
                                                  "testModel.headerData(2, Qt::Vertical).toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x7b3);
                                      QVariant::~QVariant(&local_650);
                                      if (((bVar1 ^ 0xff) & 1) == 0) {
                                        local_154 = 0;
                                      }
                                      else {
                                        local_154 = 1;
                                      }
                                    }
                                    else {
                                      local_154 = 1;
                                    }
                                  }
                                  else {
                                    local_154 = 1;
                                  }
                                }
                                else {
                                  local_154 = 1;
                                }
                              }
                              else {
                                local_154 = 1;
                              }
                            }
                            else {
                              local_154 = 1;
                            }
                          }
                          else {
                            local_154 = 1;
                          }
                        }
                        else {
                          local_154 = 1;
                        }
                      }
                      else {
                        local_154 = 1;
                      }
                    }
                    else {
                      local_154 = 1;
                    }
                  }
                  else {
                    local_154 = 1;
                  }
                }
                else {
                  local_154 = 1;
                }
              }
              else {
                local_154 = 1;
              }
            }
            else {
              local_154 = 1;
            }
          }
          else {
            local_154 = 1;
          }
        }
        else {
          local_154 = 1;
        }
      }
    }
  }
  else {
    local_154 = 1;
  }
  ModelTest::~ModelTest((ModelTest *)local_e0);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsFromRootToBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 5, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 4, parIndex);
    testModel.insertRow(0, parIndex);

    QVERIFY(testModel.moveRows(QModelIndex(), 2, 2, parIndex, 1));
    QCOMPARE(testModel.rowCount(parIndex), 3);
    QCOMPARE(testModel.columnCount(parIndex), 4);
    QCOMPARE(testModel.rowCount(), 3);
    QCOMPARE(testModel.columnCount(), 3);

    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("2,0"));
    QCOMPARE(testModel.index(2, 0, parIndex).data().toString(), QStringLiteral("3,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("2,2"));
    QCOMPARE(testModel.index(2, 2, parIndex).data().toString(), QStringLiteral("3,2"));
    QVERIFY(testModel.index(1, 3, parIndex).isValid());
    QVERIFY(testModel.index(2, 3, parIndex).isValid());
    QVERIFY(!testModel.index(1, 3, parIndex).data().isValid());
    QVERIFY(!testModel.index(2, 3, parIndex).data().isValid());
    QCOMPARE(testModel.index(0, 0).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(1, 0).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(2, 0).data().toString(), QStringLiteral("4,0"));
    QCOMPARE(testModel.headerData(0, Qt::Vertical).toInt(), 0);
    QCOMPARE(testModel.headerData(1, Qt::Vertical).toInt(), 1);
    QCOMPARE(testModel.headerData(2, Qt::Vertical).toInt(), 4);
}